

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_scene_device.cpp
# Opt level: O3

void device_render(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  int id;
  
  if (0 < embree::data) {
    id = 0;
    do {
      embree::animateSphere(id,(float)id + time);
      id = id + 1;
    } while (id < embree::data);
  }
  rtcCommitScene(DAT_002cad38);
  _DAT_002cad40 = rtcGetSceneTraversable(DAT_002cad38);
  return;
}

Assistant:

void device_render (int* pixels,
                           const unsigned int width,
                           const unsigned int height,
                           const float time,
                           const ISPCCamera& camera)
{
  /* animate sphere */
  for (int i=0; i<data.numSpheres; i++)
    animateSphere(i,time+i);

  /* commit changes to scene */
#if defined(EMBREE_SYCL_TUTORIAL)
  rtcCommitSceneWithQueue (data.g_scene, *global_gpu_queue);
#else
  rtcCommitScene (data.g_scene);
#endif
  /* The RTCTraversable object may be invaludated and has to be acquired again after the dynamic scene has been commited */
  data.g_traversable = rtcGetSceneTraversable(data.g_scene);
}